

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O0

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I,
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          *vals)

{
  bool bVar1;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> *this_00;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *in_RDI;
  RWNode **val;
  iterator __end0;
  iterator __begin0;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *__range3
  ;
  bool changed;
  undefined1 in_stack_00000207;
  RWNode **in_stack_00000208;
  IntervalT *in_stack_00000210;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *in_stack_00000218;
  _Self local_38;
  _Self local_30 [2];
  byte local_19;
  
  local_19 = 0;
  local_30[0]._M_node =
       (_Base_ptr)
       std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
       ::begin(in_RDI);
  local_38._M_node =
       (_Base_ptr)
       std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(local_30,&local_38);
    if (!bVar1) break;
    this_00 = (_Rb_tree_const_iterator<dg::dda::RWNode_*> *)
              std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator*
                        ((_Rb_tree_const_iterator<dg::dda::RWNode_*> *)0x183738);
    bVar1 = DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::_add
                      (in_stack_00000218,in_stack_00000210,in_stack_00000208,(bool)in_stack_00000207
                      );
    local_19 = (local_19 & 1) != 0 || bVar1;
    std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator++(this_00);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool add(const IntervalT &I, const ContT &vals) {
        bool changed = false;
        for (const ValueT &val : vals) {
            changed |= _add(I, val, false);
        }
        return changed;
    }